

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-batch.cpp
# Opt level: O0

void __thiscall
llama_batch_allocr::llama_batch_allocr(llama_batch_allocr *this,llama_batch in_batch,llama_pos p0)

{
  reference pvVar1;
  int *piVar2;
  size_type sVar3;
  reference ppiVar4;
  pointer pvVar5;
  int **ppiVar6;
  reference pvVar7;
  char *pcVar8;
  int in_ESI;
  int *in_RDI;
  int32_t i_2;
  int32_t i_1;
  int32_t i;
  int *__new_size;
  vector<int,_std::allocator<int>_> *this_00;
  int local_28;
  int local_24;
  int local_20;
  
  in_RDI[0xe] = 0;
  __new_size = in_RDI + 0x10;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x3c50b9);
  this_00 = (vector<int,_std::allocator<int>_> *)(in_RDI + 0x16);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x3c50cc);
  std::vector<int_*,_std::allocator<int_*>_>::vector
            ((vector<int_*,_std::allocator<int_*>_> *)0x3c50df);
  std::vector<signed_char,_std::allocator<signed_char>_>::vector
            ((vector<signed_char,_std::allocator<signed_char>_> *)0x3c50f5);
  memcpy(in_RDI,&stack0x00000008,0x38);
  if (*in_RDI < 1) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-batch.cpp"
               ,0x116,"GGML_ASSERT(%s) failed","batch.n_tokens > 0");
  }
  if (*(long *)(in_RDI + 6) == 0) {
    std::vector<int,_std::allocator<int>_>::resize(this_00,(size_type)__new_size);
    for (local_20 = 0; local_20 < *in_RDI; local_20 = local_20 + 1) {
      pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x10),(long)local_20);
      *pvVar1 = local_20 + in_ESI;
    }
    piVar2 = std::vector<int,_std::allocator<int>_>::data
                       ((vector<int,_std::allocator<int>_> *)0x3c51e8);
    *(int **)(in_RDI + 6) = piVar2;
  }
  if (*(long *)(in_RDI + 8) == 0) {
    std::vector<int,_std::allocator<int>_>::resize(this_00,(size_type)__new_size);
    for (local_24 = 0; local_24 < *in_RDI; local_24 = local_24 + 1) {
      sVar3 = std::array<int,_1UL>::size((array<int,_1UL> *)(in_RDI + 0xe));
      pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x16),(long)local_24);
      *pvVar1 = (value_type)sVar3;
    }
    piVar2 = std::vector<int,_std::allocator<int>_>::data
                       ((vector<int,_std::allocator<int>_> *)0x3c5271);
    *(int **)(in_RDI + 8) = piVar2;
  }
  if (*(long *)(in_RDI + 10) == 0) {
    std::vector<int_*,_std::allocator<int_*>_>::resize
              ((vector<int_*,_std::allocator<int_*>_> *)this_00,(size_type)__new_size);
    ppiVar4 = std::vector<int_*,_std::allocator<int_*>_>::operator[]
                        ((vector<int_*,_std::allocator<int_*>_> *)(in_RDI + 0x1c),(long)*in_RDI);
    *ppiVar4 = (value_type)0x0;
    for (local_28 = 0; local_28 < *in_RDI; local_28 = local_28 + 1) {
      pvVar5 = std::array<int,_1UL>::data((array<int,_1UL> *)0x3c52e5);
      ppiVar4 = std::vector<int_*,_std::allocator<int_*>_>::operator[]
                          ((vector<int_*,_std::allocator<int_*>_> *)(in_RDI + 0x1c),(long)local_28);
      *ppiVar4 = pvVar5;
    }
    ppiVar6 = std::vector<int_*,_std::allocator<int_*>_>::data
                        ((vector<int_*,_std::allocator<int_*>_> *)0x3c5320);
    *(int ***)(in_RDI + 10) = ppiVar6;
  }
  if (*(long *)(in_RDI + 0xc) == 0) {
    std::vector<signed_char,_std::allocator<signed_char>_>::resize
              ((vector<signed_char,_std::allocator<signed_char>_> *)this_00,(size_type)__new_size);
    sVar3 = std::vector<signed_char,_std::allocator<signed_char>_>::size
                      ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RDI + 0x22));
    pvVar7 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                       ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RDI + 0x22),
                        sVar3 - 1);
    *pvVar7 = '\x01';
    pcVar8 = std::vector<signed_char,_std::allocator<signed_char>_>::data
                       ((vector<signed_char,_std::allocator<signed_char>_> *)0x3c5395);
    *(char **)(in_RDI + 0xc) = pcVar8;
  }
  return;
}

Assistant:

llama_batch_allocr::llama_batch_allocr(struct llama_batch in_batch, llama_pos p0) {
    batch = in_batch;
    GGML_ASSERT(batch.n_tokens > 0);
    if (!batch.pos) {
        pos.resize(batch.n_tokens);
        for (int32_t i = 0; i < batch.n_tokens; i++) {
            pos[i] = i + p0;
        }
        batch.pos = pos.data();
    }
    if (!batch.n_seq_id) {
        n_seq_id.resize(batch.n_tokens);
        for (int32_t i = 0; i < batch.n_tokens; i++) {
            n_seq_id[i] = seq_id_0.size();
        }
        batch.n_seq_id = n_seq_id.data();
    }
    if (!batch.seq_id) {
        seq_id.resize(batch.n_tokens + 1);
        seq_id[batch.n_tokens] = NULL;
        for (int32_t i = 0; i < batch.n_tokens; i++) {
            seq_id[i] = seq_id_0.data();
        }
        batch.seq_id = seq_id.data();
    }
    if (!batch.logits) {
        logits.resize(batch.n_tokens);
        logits[logits.size() - 1] = true;
        batch.logits = logits.data();
    }
}